

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O2

void Sfm_DecStop(Sfm_Dec_t *p)

{
  uint uVar1;
  Abc_Ntk_t *pNtk;
  uint uVar2;
  Abc_Obj_t *pObj;
  uint i;
  long lVar3;
  
  pNtk = p->pNtk;
  for (i = 0; (int)i < pNtk->vObjs->nSize; i = i + 1) {
    pObj = Abc_NtkObj(pNtk,i);
    if ((pObj != (Abc_Obj_t *)0x0) && (uVar1 = *(uint *)&pObj->field_0x14, (uVar1 & 0xf) == 7)) {
      uVar2 = Abc_ObjLevelNew(pObj);
      if (uVar1 >> 0xc != uVar2) {
        printf("Level count mismatch at node %d.\n",(ulong)i);
      }
    }
  }
  Sfm_LibStop(p->pLib);
  if (p->pTim != (Sfm_Tim_t *)0x0) {
    Sfm_TimStop(p->pTim);
  }
  if (p->pMit != (Sfm_Mit_t *)0x0) {
    Sfm_MitStop(p->pMit);
  }
  for (lVar3 = 0x66; lVar3 != 0x6e; lVar3 = lVar3 + 1) {
    if (*(void **)(p->GateAnd + lVar3 * 2 + -0x1e) != (void *)0x0) {
      free(*(void **)(p->GateAnd + lVar3 * 2 + -0x1e));
      (p->GateAnd + lVar3 * 2 + -0x1e)[0] = 0;
      (p->GateAnd + lVar3 * 2 + -0x1e)[1] = 0;
    }
  }
  Vec_IntErase(&p->vGateSizes);
  Vec_WrdErase(&p->vGateFuncs);
  Vec_WecErase(&p->vGateCnfs);
  Vec_PtrErase(&p->vGateHands);
  Vec_IntErase(&p->vObjRoots);
  Vec_IntErase(&p->vObjGates);
  Vec_WecErase(&p->vObjFanins);
  Vec_IntErase(&p->vObjMap);
  Vec_IntErase(&p->vObjDec);
  Vec_IntErase(&p->vObjMffc);
  Vec_IntErase(&p->vObjInMffc);
  Vec_WrdErase(&p->vObjSims);
  Vec_WrdErase(&p->vObjSims2);
  Vec_PtrErase(&p->vMatchGates);
  Vec_PtrErase(&p->vMatchFans);
  sat_solver_delete(p->pSat);
  Vec_WecErase(&p->vClauses);
  Vec_IntErase(p->vImpls);
  Vec_IntErase(p->vImpls + 1);
  Vec_WrdErase(p->vSets);
  Vec_WrdErase(p->vSets + 1);
  Vec_IntErase(&p->vNewNodes);
  Vec_IntErase(&p->vGateTfi);
  Vec_IntErase(&p->vGateTfo);
  Vec_IntErase(&p->vGateCut);
  Vec_IntErase(&p->vGateTemp);
  Vec_IntErase(&p->vGateMffc);
  Vec_IntErase(&p->vCands);
  free(p);
  pNtk->pData = (void *)0x0;
  return;
}

Assistant:

void Sfm_DecStop( Sfm_Dec_t * p )
{
    Abc_Ntk_t * pNtk = p->pNtk;
    Abc_Obj_t * pObj; int i;
    Abc_NtkForEachNode( pNtk, pObj, i )
        if ( (int)pObj->Level != Abc_ObjLevelNew(pObj) )
            printf( "Level count mismatch at node %d.\n", i );
    Sfm_LibStop( p->pLib );
    if ( p->pTim ) Sfm_TimStop( p->pTim );
    if ( p->pMit ) Sfm_MitStop( p->pMit );
    // divisors
    for ( i = 0; i < SFM_SUPP_MAX; i++ )
        ABC_FREE( p->pDivWords[i] );
    // library
    Vec_IntErase( &p->vGateSizes );
    Vec_WrdErase( &p->vGateFuncs );
    Vec_WecErase( &p->vGateCnfs );
    Vec_PtrErase( &p->vGateHands );
    // objects
    Vec_IntErase( &p->vObjRoots );
    Vec_IntErase( &p->vObjGates );
    Vec_WecErase( &p->vObjFanins );
    Vec_IntErase( &p->vObjMap );
    Vec_IntErase( &p->vObjDec );
    Vec_IntErase( &p->vObjMffc );
    Vec_IntErase( &p->vObjInMffc );
    Vec_WrdErase( &p->vObjSims );
    Vec_WrdErase( &p->vObjSims2 );
    Vec_PtrErase( &p->vMatchGates );
    Vec_PtrErase( &p->vMatchFans );
    // solver
    sat_solver_delete( p->pSat );
    Vec_WecErase( &p->vClauses );
    Vec_IntErase( &p->vImpls[0] );
    Vec_IntErase( &p->vImpls[1] );
    Vec_WrdErase( &p->vSets[0] );
    Vec_WrdErase( &p->vSets[1] );
    // temporary
    Vec_IntErase( &p->vNewNodes );
    Vec_IntErase( &p->vGateTfi );
    Vec_IntErase( &p->vGateTfo );
    Vec_IntErase( &p->vGateCut );
    Vec_IntErase( &p->vGateTemp );
    Vec_IntErase( &p->vGateMffc );
    Vec_IntErase( &p->vCands );
    ABC_FREE( p );
    pNtk->pData = NULL;
}